

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_popBack
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer psVar1;
  long lVar2;
  undefined8 *puVar3;
  shared_ptr<Instance> instance;
  
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    psVar1 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(this->_value).
                  super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
    if (lVar2 == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"null",(allocator *)&instance);
    }
    else {
      std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar1->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 (lVar2 * 0x10000000 + -0x100000000 >> 0x1c)));
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::pop_back
                (&this->_value);
      (*(instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Instance
        [2])(__return_storage_ptr__);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    return __return_storage_ptr__;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(int(_value.size()) - n), '"') + "\"";
}